

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall amrex::ParmParse::PP_entry::PP_entry(PP_entry *this,PP_entry *pe)

{
  void *pvVar1;
  string *in_RSI;
  string *in_RDI;
  list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *unaff_retaddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000010;
  string *__x;
  
  __x = in_RDI;
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_00000010,in_stack_00000008);
  *(undefined8 *)(in_RDI + 0x38) = 0;
  in_RDI[0x40] = (string)((byte)in_RSI[0x40] & 1);
  if (*(long *)(in_RSI + 0x38) != 0) {
    pvVar1 = operator_new(0x18);
    std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
    list(unaff_retaddr,
         (list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)__x);
    *(void **)(in_RDI + 0x38) = pvVar1;
  }
  return;
}

Assistant:

ParmParse::PP_entry::PP_entry (const PP_entry& pe)
    : m_name(pe.m_name),
      m_vals(pe.m_vals),
      m_table(0),
      m_queried(pe.m_queried)
{
    if ( pe.m_table )
    {
        m_table = new Table(*pe.m_table);
    }
}